

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

bool pbrt::WritePLY(string *filename,span<const_int> triIndices,span<const_int> quadIndices,
                   span<const_pbrt::Point3<float>_> p,span<const_pbrt::Normal3<float>_> n,
                   span<const_pbrt::Point2<float>_> uv,span<const_int> faceIndices)

{
  undefined1 auVar1 [16];
  bool bVar2;
  p_ply ptVar3;
  size_t sVar4;
  size_t sVar5;
  int i_2;
  int i_1;
  int i;
  int nQuads;
  int nTriangles;
  int nVertices;
  p_ply plyFile;
  long in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  p_ply in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  p_ply in_stack_ffffffffffffff28;
  p_ply in_stack_ffffffffffffff30;
  p_ply in_stack_ffffffffffffff38;
  int local_50;
  int local_4c;
  int local_48;
  span<const_int> local_28;
  span<const_int> local_18;
  bool local_1;
  
  std::__cxx11::string::c_str();
  ptVar3 = ply_create((char *)in_stack_ffffffffffffff38,
                      (e_ply_storage_mode)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                      (p_ply_error_cb)in_stack_ffffffffffffff28,(long)in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff18);
  if (ptVar3 == (p_ply)0x0) {
    local_1 = false;
  }
  else {
    sVar4 = pstd::span<const_pbrt::Point3<float>_>::size
                      ((span<const_pbrt::Point3<float>_> *)&stack0x00000008);
    ply_add_element(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ply_add_scalar_property
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ply_add_scalar_property
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    ply_add_scalar_property
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    bVar2 = pstd::span<const_pbrt::Normal3<float>_>::empty
                      ((span<const_pbrt::Normal3<float>_> *)0xa04d18);
    if (!bVar2) {
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    bVar2 = pstd::span<const_pbrt::Point2<float>_>::empty
                      ((span<const_pbrt::Point2<float>_> *)0xa04d74);
    if (!bVar2) {
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    sVar5 = pstd::span<const_int>::size(&local_18);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar5;
    sVar5 = pstd::span<const_int>::size(&local_28);
    ply_add_element(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ply_add_list_property
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (e_ply_type)in_stack_ffffffffffffff18);
    bVar2 = pstd::span<const_int>::empty((span<const_int> *)0xa04e30);
    if (!bVar2) {
      ply_add_scalar_property
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (e_ply_type)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    ply_write_header(in_stack_ffffffffffffff28);
    for (local_48 = 0; local_48 < (int)sVar4; local_48 = local_48 + 1) {
      pstd::span<const_pbrt::Point3<float>_>::operator[]
                ((span<const_pbrt::Point3<float>_> *)&stack0x00000008,(long)local_48);
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_pbrt::Point3<float>_>::operator[]
                ((span<const_pbrt::Point3<float>_> *)&stack0x00000008,(long)local_48);
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_pbrt::Point3<float>_>::operator[]
                ((span<const_pbrt::Point3<float>_> *)&stack0x00000008,(long)local_48);
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      bVar2 = pstd::span<const_pbrt::Normal3<float>_>::empty
                        ((span<const_pbrt::Normal3<float>_> *)0xa04f2a);
      if (!bVar2) {
        pstd::span<const_pbrt::Normal3<float>_>::operator[]
                  ((span<const_pbrt::Normal3<float>_> *)&stack0x00000018,(long)local_48);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
        pstd::span<const_pbrt::Normal3<float>_>::operator[]
                  ((span<const_pbrt::Normal3<float>_> *)&stack0x00000018,(long)local_48);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
        pstd::span<const_pbrt::Normal3<float>_>::operator[]
                  ((span<const_pbrt::Normal3<float>_> *)&stack0x00000018,(long)local_48);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      }
      bVar2 = pstd::span<const_pbrt::Point2<float>_>::empty
                        ((span<const_pbrt::Point2<float>_> *)0xa04fdd);
      if (!bVar2) {
        pstd::span<const_pbrt::Point2<float>_>::operator[]
                  ((span<const_pbrt::Point2<float>_> *)&stack0x00000028,(long)local_48);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
        pstd::span<const_pbrt::Point2<float>_>::operator[]
                  ((span<const_pbrt::Point2<float>_> *)&stack0x00000028,(long)local_48);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      }
    }
    for (local_4c = 0; local_4c < SUB164(auVar1 / ZEXT816(3),0); local_4c = local_4c + 1) {
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff38 = ptVar3;
      pstd::span<const_int>::operator[](&local_18,(long)(local_4c * 3));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_int>::operator[](&local_18,(long)(local_4c * 3 + 1));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_int>::operator[](&local_18,(long)(local_4c * 3 + 2));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      bVar2 = pstd::span<const_int>::empty((span<const_int> *)0xa05142);
      if (!bVar2) {
        in_stack_ffffffffffffff30 = ptVar3;
        pstd::span<const_int>::operator[]((span<const_int> *)&stack0x00000038,(long)local_4c);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      }
    }
    for (local_50 = 0; local_50 < (int)(sVar5 >> 2); local_50 = local_50 + 1) {
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_int>::operator[](&local_28,(long)(local_50 << 2));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff18 = ptVar3;
      pstd::span<const_int>::operator[](&local_28,(long)(local_50 * 4 + 1));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_int>::operator[](&local_28,(long)(local_50 * 4 + 2));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      pstd::span<const_int>::operator[](&local_28,(long)(local_50 * 4 + 3));
      ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      bVar2 = pstd::span<const_int>::empty((span<const_int> *)0xa052ac);
      if (!bVar2) {
        pstd::span<const_int>::operator[]((span<const_int> *)&stack0x00000038,(long)local_50);
        ply_write(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
      }
    }
    ply_close(in_stack_ffffffffffffff18);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool WritePLY(std::string filename, pstd::span<const int> triIndices,
              pstd::span<const int> quadIndices, pstd::span<const Point3f> p,
              pstd::span<const Normal3f> n, pstd::span<const Point2f> uv,
              pstd::span<const int> faceIndices) {
    p_ply plyFile =
        ply_create(filename.c_str(), PLY_DEFAULT, PlyErrorCallback, 0, nullptr);
    if (!plyFile)
        return false;

    int nVertices = p.size();
    ply_add_element(plyFile, "vertex", nVertices);
    ply_add_scalar_property(plyFile, "x", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "y", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "z", PLY_FLOAT);
    if (!n.empty()) {
        ply_add_scalar_property(plyFile, "nx", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "ny", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "nz", PLY_FLOAT);
    }
    if (!uv.empty()) {
        ply_add_scalar_property(plyFile, "u", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "v", PLY_FLOAT);
    }

    int nTriangles = triIndices.size() / 3, nQuads = quadIndices.size() / 4;
    ply_add_element(plyFile, "face", nTriangles + nQuads);
    ply_add_list_property(plyFile, "vertex_indices", PLY_UINT8, PLY_INT);
    if (!faceIndices.empty())
        ply_add_scalar_property(plyFile, "face_indices", PLY_INT);

    ply_write_header(plyFile);

    for (int i = 0; i < nVertices; ++i) {
        ply_write(plyFile, p[i].x);
        ply_write(plyFile, p[i].y);
        ply_write(plyFile, p[i].z);
        if (!n.empty()) {
            ply_write(plyFile, n[i].x);
            ply_write(plyFile, n[i].y);
            ply_write(plyFile, n[i].z);
        }
        if (!uv.empty()) {
            ply_write(plyFile, uv[i].x);
            ply_write(plyFile, uv[i].y);
        }
    }

    for (int i = 0; i < nTriangles; ++i) {
        ply_write(plyFile, 3);
        ply_write(plyFile, triIndices[3 * i]);
        ply_write(plyFile, triIndices[3 * i + 1]);
        ply_write(plyFile, triIndices[3 * i + 2]);
        if (!faceIndices.empty())
            ply_write(plyFile, faceIndices[i]);
    }
    for (int i = 0; i < nQuads; ++i) {
        ply_write(plyFile, 4);
        ply_write(plyFile, quadIndices[4 * i]);
        ply_write(plyFile, quadIndices[4 * i + 1]);
        ply_write(plyFile, quadIndices[4 * i + 2]);
        ply_write(plyFile, quadIndices[4 * i + 3]);
        if (!faceIndices.empty())
            ply_write(plyFile, faceIndices[i]);
    }

    ply_close(plyFile);
    return true;
}